

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

void __thiscall QTimer::timerEvent(QTimer *this,QTimerEvent *e)

{
  QObjectData *pQVar1;
  parameter_type pVar2;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (e->m_id == (TimerId)pQVar1[1].children.d.size) {
    pVar2 = QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
            ::value((QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
                     *)&pQVar1[1].metaObject);
    if (pVar2) {
      stop(this);
    }
    timeout(this);
    return;
  }
  return;
}

Assistant:

void QTimer::timerEvent(QTimerEvent *e)
{
    Q_D(QTimer);
    if (e->id() == d->id) {
        if (d->single)
            stop();
        emit timeout(QPrivateSignal());
    }
}